

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O2

int findparameter(MOJOSHADER_effectParam *params,uint32 param_count,char *name)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (param_count == uVar2) {
      __assert_fail("0 && \"Parameter not found!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0xf3,
                    "int findparameter(const MOJOSHADER_effectParam *, const uint32, const char *)")
      ;
    }
    iVar1 = strcmp(name,(params->value).name);
    if (iVar1 == 0) break;
    uVar2 = uVar2 + 1;
    params = params + 1;
  }
  return (int)uVar2;
}

Assistant:

static int findparameter(const MOJOSHADER_effectParam *params,
                         const uint32 param_count,
                         const char *name)
{
    int i;
    for (i = 0; i < param_count; i++)
        if (strcmp(name, params[i].value.name) == 0)
            return i;
    assert(0 && "Parameter not found!");
}